

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethod::SequenceMethod
          (SequenceMethod *this,KnownSystemName knownNameId,bool isMatched)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__SequenceMethod_00e55fc8;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  return;
}

Assistant:

SequenceMethod(KnownSystemName knownNameId, bool isMatched) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isMatched(isMatched) {}